

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O3

void __thiscall
Catch::Capturer::captureValues<char[4],int,char>
          (Capturer *this,size_t index,char (*value) [4],int *values,char *values_1)

{
  void *pvVar1;
  int *piVar2;
  char *pcVar3;
  StringRef string;
  string local_50;
  
  piVar2 = values;
  pvVar1 = memchr(value,0,4);
  pcVar3 = (char *)((long)pvVar1 - (long)value);
  if (pvVar1 == (void *)0x0) {
    pcVar3 = (char *)0x4;
  }
  string.m_size = (size_type)piVar2;
  string.m_start = pcVar3;
  Detail::convertIntoString_abi_cxx11_(&local_50,(Detail *)value,string);
  captureValue(this,index,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  captureValues<int,char>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }